

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void free_yang_common(lys_module *module,lys_node *node)

{
  long lVar1;
  ulong uVar2;
  
  yang_tpdf_free(module->ctx,module->tpdf,'\0',module->tpdf_size);
  module->tpdf_size = '\0';
  yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  yang_free_nodes(module->ctx,node);
  if (module->augment_size != '\0') {
    lVar1 = 0;
    uVar2 = 0;
    do {
      yang_free_augment(module->ctx,(lys_node_augment *)(module->augment->padding + lVar1 + -0x1c));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x68;
    } while (uVar2 < module->augment_size);
  }
  module->augment_size = '\0';
  if (module->deviation_size != '\0') {
    lVar1 = 0;
    uVar2 = 0;
    do {
      yang_free_deviate(module->ctx,(lys_deviation *)((long)&module->deviation->target_name + lVar1)
                        ,0);
      free(*(void **)((long)&module->deviation->deviate + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x38;
    } while (uVar2 < module->deviation_size);
  }
  module->deviation_size = '\0';
  return;
}

Assistant:

static void
free_yang_common(struct lys_module *module, struct lys_node *node)
{
    uint i;
    yang_tpdf_free(module->ctx, module->tpdf, 0, module->tpdf_size);
    module->tpdf_size = 0;
    yang_free_ident_base(module->ident, 0, module->ident_size);
    yang_free_nodes(module->ctx, node);
    for (i = 0; i < module->augment_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    module->augment_size = 0;
    for (i = 0; i < module->deviation_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    module->deviation_size = 0;
}